

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O1

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::SideShapeFunction
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,int side,TPZVec<double> *point,
          TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long lVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  MElementType MVar6;
  uint uVar7;
  long lVar8;
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar9;
  uint uVar10;
  TPZCompElHDiv<pzshape::TPZShapeLinear> *pTVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  REAL detjac;
  TPZManVector<int,_3> ord;
  TPZManVector<int,_9> permutegather;
  TPZGeoElSide gelside;
  TPZManVector<long,_8> id;
  TPZFNMatrix<9,_double> jac;
  TPZFNMatrix<9,_double> jacinv;
  TPZFNMatrix<9,_double> axes;
  TPZManVector<long,_28> FirstIndex;
  TPZFNMatrix<50,_double> dphiloc;
  TPZFNMatrix<50,_double> philoc;
  REAL local_948;
  ulong local_940;
  TPZCompElHDiv<pzshape::TPZShapeLinear> *local_938;
  TPZVec<int> local_930;
  uint local_910;
  uint local_90c;
  uint local_908;
  long local_900;
  TPZFMatrix<double> *local_8f8;
  TPZFMatrix<double> *local_8f0;
  ulong local_8e8;
  TPZManVector<int,_9> local_8e0;
  TPZGeoElSide local_898;
  TPZManVector<long,_8> local_880;
  TPZFMatrix<double> local_820;
  double local_790 [10];
  TPZFMatrix<double> local_740;
  double local_6b0 [10];
  TPZFMatrix<double> local_660;
  double local_5d0 [10];
  TPZManVector<long,_28> local_580;
  TPZFMatrix<double> local_480;
  double local_3f0 [51];
  TPZFMatrix<double> local_258;
  double local_1c8 [51];
  
  local_8f8 = phi;
  local_8f0 = dphi;
  if ((side == 3) || (point->fNElements != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Don\'t have side shape associated to this side",0x2d);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
               ,0x1cf);
  }
  iVar2 = pztopology::TPZLine::SideDimension(side);
  if (iVar2 == 0) {
    iVar2 = pztopology::TPZLine::NContainedSides(side);
    iVar17 = 0;
    uVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x250))(this,0,side);
    local_938 = this;
    lVar8 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,uVar3);
    uVar10 = (uint)*(byte *)(lVar8 + 0x14);
    if (0 < iVar2) {
      iVar17 = 0;
      iVar13 = 0;
      do {
        iVar4 = pztopology::TPZLine::ContainedSideLocId(side,iVar13);
        iVar4 = pzshape::TPZShapeLinear::NConnectShapeF(iVar4,uVar10);
        iVar17 = iVar17 + iVar4;
        iVar13 = iVar13 + 1;
      } while (iVar2 != iVar13);
    }
    this_00 = TPZCompEl::Reference((TPZCompEl *)local_938);
    uVar5 = pztopology::TPZLine::NSideNodes(side);
    TPZManVector<long,_8>::TPZManVector(&local_880,(long)(int)uVar5);
    if (0 < (int)uVar5) {
      uVar14 = 0;
      do {
        iVar13 = pztopology::TPZLine::SideNodeLocId(side,(int)uVar14);
        pTVar9 = TPZGeoEl::Node(this_00,iVar13);
        local_880.super_TPZVec<long>.fStore[uVar14] = (long)pTVar9->fId;
        uVar14 = uVar14 + 1;
      } while (uVar5 != uVar14);
    }
    TPZManVector<int,_9>::TPZManVector(&local_8e0,(long)iVar2);
    MVar6 = pztopology::TPZLine::Type(side);
    if (MVar6 == EOned) {
      iVar2 = pztopology::TPZLine::GetTransformId(&local_880.super_TPZVec<long>);
      pztopology::TPZLine::GetSideHDivPermutation(iVar2,&local_8e0.super_TPZVec<int>);
    }
    else if (MVar6 == ETriangle) {
      iVar2 = pztopology::TPZTriangle::GetTransformId(&local_880.super_TPZVec<long>);
      pztopology::TPZTriangle::GetSideHDivPermutation(iVar2,&local_8e0.super_TPZVec<int>);
    }
    else {
      if (MVar6 != EQuadrilateral) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
                   ,0x200);
      }
      iVar2 = pztopology::TPZQuadrilateral::GetTransformId(&local_880.super_TPZVec<long>);
      pztopology::TPZQuadrilateral::GetSideHDivPermutation(iVar2,&local_8e0.super_TPZVec<int>);
    }
    TPZVec<int>::TPZVec(&local_930,0);
    local_900 = CONCAT44(local_900._4_4_,MVar6);
    local_930.fStore = (int *)&local_910;
    local_930._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018437d0;
    local_930.fNElements = 3;
    local_930.fNAlloc = 0;
    local_910 = uVar10;
    local_90c = uVar10;
    local_908 = uVar10;
    uVar5 = pztopology::TPZLine::SideDimension(side);
    lVar8 = (long)iVar17;
    local_258.fElem = local_1c8;
    local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018e0e68;
    local_258.fSize = 0x32;
    local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar8;
    local_258.fGiven = local_258.fElem;
    TPZVec<int>::TPZVec(&local_258.fPivot.super_TPZVec<int>,0);
    local_258.fPivot.super_TPZVec<int>.fStore = local_258.fPivot.fExtAlloc;
    local_258.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_258.fPivot.super_TPZVec<int>.fNElements = 0;
    local_258.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_258.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_258.fWork.fStore = (double *)0x0;
    local_258.fWork.fNElements = 0;
    local_258.fWork.fNAlloc = 0;
    if (iVar17 == 0) {
      local_258.fElem = (double *)0x0;
    }
    else if (0x32 < iVar17) {
      local_258.fElem = (double *)operator_new__(lVar8 * 8);
    }
    local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018e0b78;
    local_480.fElem = local_3f0;
    local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018e0e68;
    local_480.fSize = 0x32;
    local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (long)(int)uVar5;
    local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar8;
    local_480.fGiven = local_480.fElem;
    TPZVec<int>::TPZVec(&local_480.fPivot.super_TPZVec<int>,0);
    local_480.fPivot.super_TPZVec<int>.fStore = local_480.fPivot.fExtAlloc;
    local_480.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_480.fPivot.super_TPZVec<int>.fNElements = 0;
    local_480.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_480.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_480.fWork.fStore = (double *)0x0;
    local_480.fWork.fNElements = 0;
    local_480.fWork.fNAlloc = 0;
    uVar14 = (int)uVar5 * lVar8;
    if (uVar14 == 0) {
      local_480.fElem = (double *)0x0;
    }
    else if (0x32 < (long)uVar14) {
      uVar12 = 0xffffffffffffffff;
      if (uVar14 < 0x2000000000000000) {
        uVar12 = uVar14 * 8;
      }
      local_480.fElem = (double *)operator_new__(uVar12);
    }
    local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018e0b78;
    pzshape::TPZShapeLinear::SideShape
              (side,point,&local_880.super_TPZVec<long>,&local_930,&local_258,&local_480);
    uVar7 = pztopology::TPZLine::NContainedSides(side);
    local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)0x0;
    TPZManVector<long,_28>::TPZManVector(&local_580,(long)(int)(uVar7 + 1),(long *)&local_820);
    local_940 = (ulong)uVar7;
    if (0 < (int)uVar7) {
      uVar14 = 0;
      do {
        iVar2 = pztopology::TPZLine::ContainedSideLocId(side,(int)uVar14);
        lVar8 = local_580.super_TPZVec<long>.fStore[uVar14];
        iVar2 = pzshape::TPZShapeLinear::NConnectShapeF(iVar2,uVar10);
        local_580.super_TPZVec<long>.fStore[uVar14 + 1] = lVar8 + iVar2;
        uVar14 = uVar14 + 1;
      } while (uVar7 != uVar14);
    }
    local_948 = 1.0;
    local_898.fGeoEl = TPZCompEl::Reference((TPZCompEl *)local_938);
    local_898.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
    local_898.fSide = side;
    iVar2 = (**(code **)(*(long *)this_00 + 0x208))(this_00);
    lVar8 = (long)iVar2;
    local_820.fElem = local_790;
    local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183dbe0;
    local_820.fSize = 9;
    local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar8;
    local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar8;
    local_820.fGiven = local_820.fElem;
    TPZVec<int>::TPZVec(&local_820.fPivot.super_TPZVec<int>,0);
    local_820.fPivot.super_TPZVec<int>.fStore = local_820.fPivot.fExtAlloc;
    local_820.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_820.fPivot.super_TPZVec<int>.fNElements = 0;
    local_820.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_820.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_820.fWork.fStore = (double *)0x0;
    local_820.fWork.fNElements = 0;
    local_820.fWork.fNAlloc = 0;
    uVar14 = lVar8 * lVar8;
    if (iVar2 == 0) {
      local_820.fElem = (double *)0x0;
    }
    else if (9 < uVar14) {
      uVar12 = 0xffffffffffffffff;
      if (uVar14 < 0x2000000000000000) {
        uVar12 = uVar14 * 8;
      }
      local_820.fElem = (double *)operator_new__(uVar12);
    }
    local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
    local_740.fElem = local_6b0;
    local_740.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_740.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_740.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183dbe0;
    local_740.fSize = 9;
    local_8e8 = (ulong)uVar7;
    local_740.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar8;
    local_740.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar8;
    local_740.fGiven = local_740.fElem;
    TPZVec<int>::TPZVec(&local_740.fPivot.super_TPZVec<int>,0);
    local_740.fPivot.super_TPZVec<int>.fStore = local_740.fPivot.fExtAlloc;
    local_740.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_740.fPivot.super_TPZVec<int>.fNElements = 0;
    local_740.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_740.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_740.fWork.fStore = (double *)0x0;
    local_740.fWork.fNElements = 0;
    local_740.fWork.fNAlloc = 0;
    if (iVar2 == 0) {
      local_740.fElem = (double *)0x0;
    }
    else if (9 < uVar14) {
      uVar12 = 0xffffffffffffffff;
      if (uVar14 < 0x2000000000000000) {
        uVar12 = uVar14 * 8;
      }
      local_740.fElem = (double *)operator_new__(uVar12);
    }
    local_740.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
    local_660.fElem = local_5d0;
    local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
    local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183dbe0;
    local_660.fSize = 9;
    local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar8;
    local_660.fGiven = local_660.fElem;
    TPZVec<int>::TPZVec(&local_660.fPivot.super_TPZVec<int>,0);
    local_660.fPivot.super_TPZVec<int>.fStore = local_660.fPivot.fExtAlloc;
    local_660.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_660.fPivot.super_TPZVec<int>.fNElements = 0;
    local_660.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_660.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_660.fWork.fStore = (double *)0x0;
    local_660.fWork.fNElements = 0;
    local_660.fWork.fNAlloc = 0;
    iVar17 = (int)local_900;
    if (iVar2 == 0) {
      local_660.fElem = (double *)0x0;
    }
    else if (3 < iVar2) {
      uVar14 = 0xffffffffffffffff;
      if ((ulong)(lVar8 * 3) < 0x2000000000000000) {
        uVar14 = lVar8 * 0x18;
      }
      local_660.fElem = (double *)operator_new__(uVar14);
    }
    local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
    TPZGeoElSide::Jacobian(&local_898,point,&local_820,&local_660,&local_948,&local_740);
    TPZFMatrix<double>::~TPZFMatrix(&local_660,&PTR_PTR_0183dba8);
    TPZFMatrix<double>::~TPZFMatrix(&local_740,&PTR_PTR_0183dba8);
    TPZFMatrix<double>::~TPZFMatrix(&local_820,&PTR_PTR_0183dba8);
    if (iVar17 == 2) {
      local_948 = local_948 / 6.0;
    }
    if (0 < (int)local_940) {
      uVar14 = 0;
      do {
        local_940 = uVar14;
        uVar10 = (int)local_580.super_TPZVec<long>.fStore[local_940 + 1] -
                 (int)local_580.super_TPZVec<long>.fStore[local_940];
        if (0 < (int)uVar10) {
          lVar1 = local_580.super_TPZVec<long>.fStore[local_8e0.super_TPZVec<int>.fStore[local_940]]
          ;
          local_900 = (long)(int)local_580.super_TPZVec<long>.fStore[local_940];
          lVar8 = (long)(int)lVar1 * 8;
          lVar18 = local_900 * 8;
          pTVar11 = (TPZCompElHDiv<pzshape::TPZShapeLinear> *)0x0;
          do {
            lVar15 = (long)(pTVar11->fSideOrient).fExtAlloc + (long)(int)lVar1 + -0x68;
            if (((lVar15 < 0) ||
                (local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar15)) ||
               (local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar16 = (long)(pTVar11->fSideOrient).fExtAlloc + local_900 + -0x68;
            if (((lVar16 < 0) ||
                ((local_8f8->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar16)) ||
               ((local_8f8->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            local_8f8->fElem[lVar16] = local_258.fElem[lVar15] / local_948;
            local_938 = pTVar11;
            if (0 < (int)uVar5) {
              uVar14 = 0;
              do {
                if (((local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar14) ||
                    (lVar15 < 0)) ||
                   (local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar15)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((((local_8f0->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)uVar14)
                    || (lVar16 < 0)) ||
                   ((local_8f0->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)
                 ((long)local_8f0->fElem +
                 uVar14 * 8 + (local_8f0->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar18
                 ) = *(double *)
                      ((long)local_480.fElem +
                      uVar14 * 8 +
                      local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8) /
                     local_948;
                uVar14 = uVar14 + 1;
              } while (uVar5 != uVar14);
            }
            pTVar11 = (TPZCompElHDiv<pzshape::TPZShapeLinear> *)
                      &(pTVar11->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                       super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl.
                       field_0x1;
            lVar8 = lVar8 + 8;
            lVar18 = lVar18 + 8;
          } while (pTVar11 != (TPZCompElHDiv<pzshape::TPZShapeLinear> *)(ulong)(uVar10 & 0x7fffffff)
                  );
        }
        uVar14 = local_940 + 1;
      } while (local_940 + 1 != local_8e8);
    }
    if (local_580.super_TPZVec<long>.fStore == local_580.fExtAlloc) {
      local_580.super_TPZVec<long>.fStore = (long *)0x0;
    }
    local_580.super_TPZVec<long>.fNAlloc = 0;
    local_580.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
    if (local_580.super_TPZVec<long>.fStore != (long *)0x0) {
      operator_delete__(local_580.super_TPZVec<long>.fStore);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_480,&PTR_PTR_018e0e30);
    TPZFMatrix<double>::~TPZFMatrix(&local_258,&PTR_PTR_018e0e30);
    if ((uint *)local_930.fStore == &local_910) {
      local_930.fStore = (int *)0x0;
    }
    local_930.fNAlloc = 0;
    local_930._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if ((uint *)local_930.fStore != (uint *)0x0) {
      operator_delete__(local_930.fStore);
    }
    if (local_8e0.super_TPZVec<int>.fStore == local_8e0.fExtAlloc) {
      local_8e0.super_TPZVec<int>.fStore = (int *)0x0;
    }
    local_8e0.super_TPZVec<int>.fNAlloc = 0;
    local_8e0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_8e0.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_8e0.super_TPZVec<int>.fStore);
    }
    if (local_880.super_TPZVec<long>.fStore == local_880.fExtAlloc) {
      local_880.super_TPZVec<long>.fStore = (long *)0x0;
    }
    local_880.super_TPZVec<long>.fNAlloc = 0;
    local_880.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
    if (local_880.super_TPZVec<long>.fStore != (long *)0x0) {
      operator_delete__(local_880.super_TPZVec<long>.fStore);
    }
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SideShapeFunction(int side,TPZVec<REAL> &point,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {

    if(side==TSHAPE::NSides || point.size() != TSHAPE::Dimension-1){
        std::cout<<"Don't have side shape associated to this side";
        DebugStop();
    }
	if(TSHAPE::SideDimension(side)!= TSHAPE::Dimension -1 ){
		return ;
	}
    int ncontained = TSHAPE::NContainedSides(side);
    int nsideshape = 0;
    int connectlocid = SideConnectLocId(0, side);
    int order = this->Connect(connectlocid).Order();
    int is;
    for (is=0; is<ncontained; is++) {
        int ic = TSHAPE::ContainedSideLocId(side,is);
        nsideshape += TSHAPE::NConnectShapeF(ic,order);
    }
#ifdef PZDEBUG
    if (nsideshape != this->NSideShapeF(side)) {
        DebugStop();
    }
#endif

    TPZGeoEl *gel = this->Reference();
    //int nc = gel->NCornerNodes();
    int nsn = TSHAPE::NSideNodes(side);
    TPZManVector<int64_t,8> id(nsn);
    for (int ic=0; ic<nsn; ic++) {
        int locid = TSHAPE::SideNodeLocId(side,ic);
        id[ic] = gel->Node(locid).Id();
    }

    //int idsize = id.size();
    TPZManVector<int,9> permutegather(ncontained);
    int transformid;


    MElementType sidetype = TSHAPE::Type(side);
    switch (sidetype) {
        case EOned:
            transformid = pztopology::TPZLine::GetTransformId(id);
            pztopology::TPZLine::GetSideHDivPermutation(transformid, permutegather);
            break;
        case EQuadrilateral:
            transformid = pztopology::TPZQuadrilateral::GetTransformId(id);
            pztopology::TPZQuadrilateral::GetSideHDivPermutation(transformid, permutegather);
            break;
        case ETriangle:
            transformid = pztopology::TPZTriangle::GetTransformId(id);
            pztopology::TPZTriangle::GetSideHDivPermutation(transformid, permutegather);
            break;
        default:
            DebugStop();
            break;
    }

    TPZManVector<int,TSHAPE::NSides> ord(TSHAPE::NSides,order);

    int sidedimension = TSHAPE::SideDimension(side);
    TPZFNMatrix<50,REAL> philoc(nsideshape,1),dphiloc(sidedimension,nsideshape);

    TSHAPE::SideShape(side,point,id,ord,philoc,dphiloc);

    int ncs = TSHAPE::NContainedSides(side);
    TPZManVector<int64_t,28> FirstIndex(ncs+1,0);
    for (int ls=0; ls<ncs; ls++) {
        int localside = TSHAPE::ContainedSideLocId(side,ls);
        FirstIndex[ls+1] = FirstIndex[ls]+TSHAPE::NConnectShapeF(localside,order);
    }

    REAL detjac = 1.;
    {
        TPZGeoElSide gelside = TPZGeoElSide(this->Reference(),side);
        int dim = gel->SideDimension(side);
        TPZFNMatrix<9,REAL> jac(dim,dim),jacinv(dim,dim),axes(dim,3);
        gelside.Jacobian(point, jac, axes, detjac, jacinv);
    }
    if(sidetype == ETriangle) detjac /= 6.;
    for (int side=0; side < ncs; side++) {
        int ifirst = FirstIndex[side];
        int kfirst = FirstIndex[permutegather[side]];
        int nshape = FirstIndex[side+1]-FirstIndex[side];
        for (int i=0; i<nshape; i++) {
            phi(ifirst+i,0) = philoc(kfirst+i,0)/detjac;
            for (int d=0; d< sidedimension; d++) {
                dphi(d,ifirst+i) = dphiloc(d,kfirst+i)/detjac;
            }
        }
    }

}